

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O2

void add_data(int pass,char c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  section_t *psVar3;
  
  if (root == (section_t *)0x0) {
    err(F,"code generation before a section has been created");
  }
  if (pass == 1) {
    uVar1 = cur->datasize;
    uVar2 = cur->pc;
    psVar3 = cur;
    psVar3->datasize = uVar1 + 1;
    psVar3->pc = uVar2 + 1;
  }
  else {
    write_byte(c);
    cur->pc = cur->pc + 1;
  }
  return;
}

Assistant:

void add_data(int pass, char c)
{
    if (root == NULL)
        err(F, "code generation before a section has been created");

    if (pass == READ_PASS)
    {
        cur->pc++;
        cur->datasize++;
    }
    else
    {
        write_byte(c);
        cur->pc++;
    }
}